

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_MeshParameters::SetTextureRangePictureFrameHack(ON_MeshParameters *this)

{
  uint invalid_texture_range;
  ON_MeshParameters *this_local;
  
  Internal_SetCharHelper(this,0,'\0','\0',&this->m_texture_range);
  return;
}

Assistant:

void ON_MeshParameters::SetTextureRangePictureFrameHack()
{
  // A 2012 hack to fix cited issues. Search for calls in core Rhino
  // code for comments with more details.
  //   Fix http://mcneel.myjetbrains.com/youtrack/issue/RH-17042
  //     Setting mp.TextureRange() = 0 here fixes RH-17042.
  //     What's one more hack where picture frames are concerned?
  //     As of March 26, tech support felt this picture frame tc bug was
  //     so critical that we held up the release of Rhino 5 SR2
  //     for this fix.
  //
  //   In November of 2012, tech support felt the following
  //   five bugs were so critical, Rhino SR1 could not be released.
  //     http://dev.mcneel.com/bugtrack/?q=120560 = http://mcneel.myjetbrains.com/youtrack/issue/RH-15423
  //     http://dev.mcneel.com/bugtrack/?q=101150 = http://mcneel.myjetbrains.com/youtrack/issue/RH-12450
  //     http://dev.mcneel.com/bugtrack/?q=105787 = http://mcneel.myjetbrains.com/youtrack/issue/RH-13203
  //     http://dev.mcneel.com/bugtrack/?q=119292 = http://mcneel.myjetbrains.com/youtrack/issue/RH-15277
  //     http://dev.mcneel.com/bugtrack/?q=119294 = http://mcneel.myjetbrains.com/youtrack/issue/RH-15279
  //
  // Do not modify this code without testing all the bugs listed above.
  // If you modify this code, put in an extensive comment that includes
  // bug citations.
  unsigned int invalid_texture_range = 0;
  Internal_SetCharHelper(invalid_texture_range, 0, 0, &m_texture_range);
}